

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

ostream * nonius::detail::operator<<(ostream *os,help_text *h)

{
  pointer poVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  pointer poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> l;
  option o;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  long local_c0;
  option local_b8;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Usage: ",7);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(h->name)._M_dataplus._M_p,(h->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," [OPTIONS]\n\n",0xc);
  iVar2 = operator<<((h->options->
                     super__Vector_base<nonius::detail::option,_std::allocator<nonius::detail::option>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (h->options->
                     super__Vector_base<nonius::detail::option,_std::allocator<nonius::detail::option>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
  iVar3 = operator<<((h->options->
                     super__Vector_base<nonius::detail::option,_std::allocator<nonius::detail::option>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (h->options->
                     super__Vector_base<nonius::detail::option,_std::allocator<nonius::detail::option>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
  *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffff4f | 0x20;
  poVar5 = (h->options->
           super__Vector_base<nonius::detail::option,_std::allocator<nonius::detail::option>_>).
           _M_impl.super__Vector_impl_data._M_start;
  poVar1 = (h->options->
           super__Vector_base<nonius::detail::option,_std::allocator<nonius::detail::option>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (poVar5 != poVar1) {
    local_c0 = (long)(iVar2 + 2);
    do {
      option::option(&local_b8,poVar5);
      std::operator+(&local_e0,"--",&local_b8.long_form);
      std::operator+(&local_100,"-",&local_b8.short_form);
      if (local_b8.argument._M_string_length != 0) {
        std::operator+(&local_120,"=",&local_b8.argument);
        std::__cxx11::string::_M_append
                  ((char *)&local_e0,
                   CONCAT71(local_120._M_dataplus._M_p._1_7_,local_120._M_dataplus._M_p._0_1_));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_120._M_dataplus._M_p._1_7_,local_120._M_dataplus._M_p._0_1_) !=
            &local_120.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_120._M_dataplus._M_p._1_7_,local_120._M_dataplus._M_p._0_1_
                                  ),local_120.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_120," ",&local_b8.argument);
        std::__cxx11::string::_M_append
                  ((char *)&local_100,
                   CONCAT71(local_120._M_dataplus._M_p._1_7_,local_120._M_dataplus._M_p._0_1_));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_120._M_dataplus._M_p._1_7_,local_120._M_dataplus._M_p._0_1_) !=
            &local_120.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_120._M_dataplus._M_p._1_7_,local_120._M_dataplus._M_p._0_1_
                                  ),local_120.field_2._M_allocated_capacity + 1);
        }
      }
      *(long *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = local_c0;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_e0._M_dataplus._M_p,local_e0._M_string_length);
      *(long *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = (long)(iVar3 + 2);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_100._M_dataplus._M_p,local_100._M_string_length);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_b8.description._M_dataplus._M_p,
                          local_b8.description._M_string_length);
      local_120._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_120,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.argument._M_dataplus._M_p != &local_b8.argument.field_2) {
        operator_delete(local_b8.argument._M_dataplus._M_p,
                        local_b8.argument.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.description._M_dataplus._M_p != &local_b8.description.field_2) {
        operator_delete(local_b8.description._M_dataplus._M_p,
                        local_b8.description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.short_form._M_dataplus._M_p != &local_b8.short_form.field_2) {
        operator_delete(local_b8.short_form._M_dataplus._M_p,
                        local_b8.short_form.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.long_form._M_dataplus._M_p != &local_b8.long_form.field_2) {
        operator_delete(local_b8.long_form._M_dataplus._M_p,
                        local_b8.long_form.field_2._M_allocated_capacity + 1);
      }
      poVar5 = poVar5 + 1;
    } while (poVar5 != poVar1);
  }
  return os;
}

Assistant:

inline std::ostream& operator<<(std::ostream& os, help_text h) {
            os << "Usage: " << h.name << " [OPTIONS]\n\n";

            auto lwidth = 2 + get_max_width(h.options.begin(), h.options.end(), [](option const& o) { return 2 + o.long_form.size() + 1 + o.argument.size(); });
            auto swidth = 2 + get_max_width(h.options.begin(), h.options.end(), [](option const& o) { return 1 + o.short_form.size() + 1 + o.argument.size(); });

            os << std::left;
            for(auto o : h.options) {
                auto l = "--" + o.long_form;
                auto s = "-" + o.short_form;
                if(!o.argument.empty()) {
                    l += "=" + o.argument;
                    s += " " + o.argument;
                }
                os << std::setw(lwidth) << l
                   << std::setw(swidth) << s
                   << o.description
                   << '\n';
            }
            return os;
        }